

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *method,Reader *replacement)

{
  uint uVar1;
  uint uVar2;
  Fault f;
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  anon_class_8_1_60e9c21f _kjContextFunc919;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:919:5)>
  _kjContext919;
  
  _kjContextFunc919.method = method;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:919:5)>
  ::ContextImpl(&_kjContext919,&_kjContextFunc919);
  uVar1 = (method->_reader).dataSize;
  if (uVar1 < 0x80) {
    _kjCondition.left = 0;
  }
  else {
    _kjCondition.left = *(unsigned_long *)((long)(method->_reader).data + 8);
  }
  uVar2 = (replacement->_reader).dataSize;
  if (uVar2 < 0x80) {
    _kjCondition.right = 0;
  }
  else {
    _kjCondition.right = *(unsigned_long *)((long)(replacement->_reader).data + 8);
  }
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = _kjCondition.left == _kjCondition.right;
  if (_kjCondition.result) {
    if (uVar1 < 0xc0) {
      _kjCondition.left = 0;
    }
    else {
      _kjCondition.left = *(unsigned_long *)((long)(method->_reader).data + 0x10);
    }
    if (uVar2 < 0xc0) {
      _kjCondition.right = 0;
    }
    else {
      _kjCondition.right = *(unsigned_long *)((long)(replacement->_reader).data + 0x10);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == _kjCondition.right;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[38]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x39d,FAILED,"method.getResultStructType() == replacement.getResultStructType()",
                 "_kjCondition,\"Updated method has different results.\"",&_kjCondition,
                 (char (*) [38])"Updated method has different results.");
      this->compatibility = INCOMPATIBLE;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[41]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x39b,FAILED,"method.getParamStructType() == replacement.getParamStructType()",
               "_kjCondition,\"Updated method has different parameters.\"",&_kjCondition,
               (char (*) [41])"Updated method has different parameters.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&f);
  }
  kj::_::Debug::Context::~Context(&_kjContext919.super_Context);
  return;
}

Assistant:

void checkCompatibility(const schema::Method::Reader& method,
                          const schema::Method::Reader& replacement) {
    KJ_CONTEXT("comparing method", method.getName());

    // TODO(someday):  Allow named parameter list to be replaced by compatible struct type.
    VALIDATE_SCHEMA(method.getParamStructType() == replacement.getParamStructType(),
                    "Updated method has different parameters.");
    VALIDATE_SCHEMA(method.getResultStructType() == replacement.getResultStructType(),
                    "Updated method has different results.");
  }